

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3ed9ed6::DescriptorImpl::GetPubKeys
          (DescriptorImpl *this,set<CPubKey,_std::less<CPubKey>,_std::allocator<CPubKey>_> *pubkeys,
          set<CExtPubKey,_std::less<CExtPubKey>,_std::allocator<CExtPubKey>_> *ext_pubs)

{
  pointer puVar1;
  pointer puVar2;
  DescriptorImpl *pDVar3;
  unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
  *p;
  pointer puVar4;
  unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
  *arg;
  pointer puVar5;
  long in_FS_OFFSET;
  optional<CExtPubKey> ext_pub;
  optional<CPubKey> pub;
  CExtPubKey local_f4;
  char local_80;
  CPubKey local_7a;
  char local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  puVar1 = (this->m_pubkey_args).
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar4 = (this->m_pubkey_args).
                super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    (*((puVar4->_M_t).
       super___uniq_ptr_impl<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
       ._M_t.
       super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
       .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>._M_head_impl)->
      _vptr_PubkeyProvider[9])(&local_7a);
    if (local_39 == '\x01') {
      std::
      _Rb_tree<CPubKey,CPubKey,std::_Identity<CPubKey>,std::less<CPubKey>,std::allocator<CPubKey>>::
      _M_insert_unique<CPubKey_const&>
                ((_Rb_tree<CPubKey,CPubKey,std::_Identity<CPubKey>,std::less<CPubKey>,std::allocator<CPubKey>>
                  *)pubkeys,&local_7a);
    }
    (*((puVar4->_M_t).
       super___uniq_ptr_impl<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
       ._M_t.
       super__Tuple_impl<0UL,_(anonymous_namespace)::PubkeyProvider_*,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
       .super__Head_base<0UL,_(anonymous_namespace)::PubkeyProvider_*,_false>._M_head_impl)->
      _vptr_PubkeyProvider[10])(&local_f4);
    if (local_80 == '\x01') {
      std::
      _Rb_tree<CExtPubKey,CExtPubKey,std::_Identity<CExtPubKey>,std::less<CExtPubKey>,std::allocator<CExtPubKey>>
      ::_M_insert_unique<CExtPubKey_const&>
                ((_Rb_tree<CExtPubKey,CExtPubKey,std::_Identity<CExtPubKey>,std::less<CExtPubKey>,std::allocator<CExtPubKey>>
                  *)ext_pubs,&local_f4);
    }
  }
  puVar2 = (this->m_subdescriptor_args).
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar5 = (this->m_subdescriptor_args).
                super__Vector_base<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar5 != puVar2; puVar5 = puVar5 + 1) {
    pDVar3 = (puVar5->_M_t).
             super___uniq_ptr_impl<(anonymous_namespace)::DescriptorImpl,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
             ._M_t.
             super__Tuple_impl<0UL,_(anonymous_namespace)::DescriptorImpl_*,_std::default_delete<(anonymous_namespace)::DescriptorImpl>_>
             .super__Head_base<0UL,_(anonymous_namespace)::DescriptorImpl_*,_false>._M_head_impl;
    (*(pDVar3->super_Descriptor)._vptr_Descriptor[0xf])(pDVar3,pubkeys,ext_pubs);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void GetPubKeys(std::set<CPubKey>& pubkeys, std::set<CExtPubKey>& ext_pubs) const override
    {
        for (const auto& p : m_pubkey_args) {
            std::optional<CPubKey> pub = p->GetRootPubKey();
            if (pub) pubkeys.insert(*pub);
            std::optional<CExtPubKey> ext_pub = p->GetRootExtPubKey();
            if (ext_pub) ext_pubs.insert(*ext_pub);
        }
        for (const auto& arg : m_subdescriptor_args) {
            arg->GetPubKeys(pubkeys, ext_pubs);
        }
    }